

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

void nullcClearError(void)

{
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    if (NULLC::currExec == 0) {
      ExecutorRegVm::Resume(NULLC::executorRegVm);
      return;
    }
    if (NULLC::currExec == 1) {
      ExecutorX86::Resume(NULLC::executorX86);
      return;
    }
  }
  return;
}

Assistant:

void nullcClearError()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED((void)0);

	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		executorX86->Resume();
#endif
	}
	else if(currExec == NULLC_REG_VM)
	{
		executorRegVm->Resume();
	}
	else if(currExec == NULLC_LLVM)
	{
#ifdef NULLC_LLVM_SUPPORT
		executorLLVM->Resume();
#endif
	}
}